

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ossadmin_test.cc
# Opt level: O0

int test_get_bucket_vips(void)

{
  code *pcVar1;
  char *__s;
  OssAdminGetBucketVipsRequestType *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1c1;
  int ret;
  HttpTestListener *local_1a0;
  HttpTestListener *listener;
  string local_190;
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [55];
  allocator<char> local_109;
  string local_108 [32];
  OssAdminGetBucketVipsRequestType *local_e8;
  OssAdmin *ossadmin;
  OssAdminGetBucketVipsResponseType resp;
  OssAdminGetBucketVipsRequestType req;
  
  aliyun::OssAdminGetBucketVipsRequestType::OssAdminGetBucketVipsRequestType
            ((OssAdminGetBucketVipsRequestType *)((long)&resp.request_id.field_2 + 8));
  aliyun::OssAdminGetBucketVipsResponseType::OssAdminGetBucketVipsResponseType
            ((OssAdminGetBucketVipsResponseType *)&ossadmin);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"cn-hangzhou",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"my_appid",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"my_secret",&local_169);
  pOVar2 = (OssAdminGetBucketVipsRequestType *)
           aliyun::OssAdmin::CreateOssAdminClient(local_108,local_140,local_168);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  local_e8 = pOVar2;
  if (pOVar2 == (OssAdminGetBucketVipsRequestType *)0x0) {
    aliyun::OssAdminGetBucketVipsResponseType::~OssAdminGetBucketVipsResponseType
              ((OssAdminGetBucketVipsResponseType *)&ossadmin);
    aliyun::OssAdminGetBucketVipsRequestType::~OssAdminGetBucketVipsRequestType
              ((OssAdminGetBucketVipsRequestType *)((long)&resp.request_id.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::OssAdmin::SetProxyHost((OssAdmin *)pOVar2,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::OssAdmin::SetUseTls((OssAdmin *)local_e8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_get_bucket_vips_response;
  local_1a0 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1c1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1c1);
  HttpTestListener::Start(local_1a0);
  std::__cxx11::string::operator=((string *)(resp.request_id.field_2._M_local_buf + 8),"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"OwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.owner_account.field_2._M_local_buf + 8),"BucketName");
  aliyun::OssAdmin::GetBucketVips
            (local_e8,(OssAdminGetBucketVipsResponseType *)((long)&resp.request_id.field_2 + 8),
             (OssAdminErrorInfo *)&ossadmin);
  HttpTestListener::WaitComplete(local_1a0);
  pHVar3 = local_1a0;
  if (local_1a0 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_1a0);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_e8;
  if (local_e8 != (OssAdminGetBucketVipsRequestType *)0x0) {
    aliyun::OssAdmin::~OssAdmin((OssAdmin *)local_e8);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_get_bucket_vips() {
  OssAdminGetBucketVipsRequestType req;
  OssAdminGetBucketVipsResponseType resp;
  OssAdmin* ossadmin = OssAdmin::CreateOssAdminClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ossadmin) return 0;
  ossadmin->SetProxyHost("127.0.0.1:12234");
  ossadmin->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_get_bucket_vips_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.owner_account = "OwnerAccount";
  req.bucket_name = "BucketName";
  int ret = ossadmin->GetBucketVips(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ossadmin;
}